

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_stat.c
# Opt level: O0

stat_conflict * archive_entry_stat(archive_entry_conflict *entry)

{
  uint uVar1;
  mode_t mVar2;
  void *pvVar3;
  time_t tVar4;
  archive *paVar5;
  int64_t iVar6;
  dev_t dVar7;
  long lVar8;
  uint64_t uVar9;
  archive_entry *in_RDI;
  stat_conflict *st;
  archive_entry *local_8;
  
  if (in_RDI->stat == (void *)0x0) {
    pvVar3 = calloc(1,0x90);
    in_RDI->stat = pvVar3;
    if (in_RDI->stat == (void *)0x0) {
      return (stat_conflict *)0x0;
    }
    in_RDI->stat_valid = L'\0';
  }
  if (in_RDI->stat_valid == L'\0') {
    local_8 = (archive_entry *)in_RDI->stat;
    tVar4 = archive_entry_atime(in_RDI);
    (local_8->ae_stat).aest_birthtime = tVar4;
    tVar4 = archive_entry_ctime(in_RDI);
    *(time_t *)&(local_8->ae_stat).aest_nlink = tVar4;
    tVar4 = archive_entry_mtime(in_RDI);
    (local_8->ae_stat).aest_gid = tVar4;
    paVar5 = (archive *)archive_entry_dev(local_8);
    local_8->archive = paVar5;
    iVar6 = archive_entry_gid(in_RDI);
    (local_8->ae_stat).aest_atime_nsec = (uint32_t)iVar6;
    iVar6 = archive_entry_uid(in_RDI);
    *(int *)((long)&(local_8->ae_stat).aest_atime + 4) = (int)iVar6;
    pvVar3 = (void *)archive_entry_ino64(in_RDI);
    local_8->stat = pvVar3;
    uVar1 = archive_entry_nlink(in_RDI);
    *(ulong *)&local_8->stat_valid = (ulong)uVar1;
    dVar7 = archive_entry_rdev(local_8);
    (local_8->ae_stat).aest_ctime = dVar7;
    iVar6 = archive_entry_size(in_RDI);
    *(int64_t *)&(local_8->ae_stat).aest_ctime_nsec = iVar6;
    mVar2 = archive_entry_mode(in_RDI);
    *(mode_t *)&(local_8->ae_stat).aest_atime = mVar2;
    lVar8 = archive_entry_atime_nsec(in_RDI);
    *(long *)&(local_8->ae_stat).aest_birthtime_nsec = lVar8;
    uVar9 = archive_entry_ctime_nsec(in_RDI);
    (local_8->ae_stat).aest_size = uVar9;
    lVar8 = archive_entry_mtime_nsec(in_RDI);
    (local_8->ae_stat).aest_ino = lVar8;
    in_RDI->stat_valid = L'\x01';
  }
  else {
    local_8 = (archive_entry *)in_RDI->stat;
  }
  return (stat_conflict *)local_8;
}

Assistant:

const struct stat *
archive_entry_stat(struct archive_entry *entry)
{
	struct stat *st;
	if (entry->stat == NULL) {
		entry->stat = calloc(1, sizeof(*st));
		if (entry->stat == NULL)
			return (NULL);
		entry->stat_valid = 0;
	}

	/*
	 * If none of the underlying fields have been changed, we
	 * don't need to regenerate.  In theory, we could use a bitmap
	 * here to flag only those items that have changed, but the
	 * extra complexity probably isn't worth it.  It will be very
	 * rare for anyone to change just one field then request a new
	 * stat structure.
	 */
	if (entry->stat_valid)
		return (entry->stat);

	st = entry->stat;
	/*
	 * Use the public interfaces to extract items, so that
	 * the appropriate conversions get invoked.
	 */
	st->st_atime = archive_entry_atime(entry);
#if HAVE_STRUCT_STAT_ST_BIRTHTIME
	st->st_birthtime = archive_entry_birthtime(entry);
#endif
	st->st_ctime = archive_entry_ctime(entry);
	st->st_mtime = archive_entry_mtime(entry);
	st->st_dev = archive_entry_dev(entry);
	st->st_gid = (gid_t)archive_entry_gid(entry);
	st->st_uid = (uid_t)archive_entry_uid(entry);
	st->st_ino = (ino_t)archive_entry_ino64(entry);
	st->st_nlink = archive_entry_nlink(entry);
	st->st_rdev = archive_entry_rdev(entry);
	st->st_size = (off_t)archive_entry_size(entry);
	st->st_mode = archive_entry_mode(entry);

	/*
	 * On systems that support high-res timestamps, copy that
	 * information into struct stat.
	 */
#if HAVE_STRUCT_STAT_ST_MTIMESPEC_TV_NSEC
	st->st_atimespec.tv_nsec = archive_entry_atime_nsec(entry);
	st->st_ctimespec.tv_nsec = archive_entry_ctime_nsec(entry);
	st->st_mtimespec.tv_nsec = archive_entry_mtime_nsec(entry);
#elif HAVE_STRUCT_STAT_ST_MTIM_TV_NSEC
	st->st_atim.tv_nsec = archive_entry_atime_nsec(entry);
	st->st_ctim.tv_nsec = archive_entry_ctime_nsec(entry);
	st->st_mtim.tv_nsec = archive_entry_mtime_nsec(entry);
#elif HAVE_STRUCT_STAT_ST_MTIME_N
	st->st_atime_n = archive_entry_atime_nsec(entry);
	st->st_ctime_n = archive_entry_ctime_nsec(entry);
	st->st_mtime_n = archive_entry_mtime_nsec(entry);
#elif HAVE_STRUCT_STAT_ST_UMTIME
	st->st_uatime = archive_entry_atime_nsec(entry) / 1000;
	st->st_uctime = archive_entry_ctime_nsec(entry) / 1000;
	st->st_umtime = archive_entry_mtime_nsec(entry) / 1000;
#elif HAVE_STRUCT_STAT_ST_MTIME_USEC
	st->st_atime_usec = archive_entry_atime_nsec(entry) / 1000;
	st->st_ctime_usec = archive_entry_ctime_nsec(entry) / 1000;
	st->st_mtime_usec = archive_entry_mtime_nsec(entry) / 1000;
#endif
#if HAVE_STRUCT_STAT_ST_BIRTHTIMESPEC_TV_NSEC
	st->st_birthtimespec.tv_nsec = archive_entry_birthtime_nsec(entry);
#endif

	/*
	 * TODO: On Linux, store 32 or 64 here depending on whether
	 * the cached stat structure is a stat32 or a stat64.  This
	 * will allow us to support both variants interchangeably.
	 */
	entry->stat_valid = 1;

	return (st);
}